

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::internal::TracingMuxerImpl::ConsumerImpl::OnConnect(ConsumerImpl *this)

{
  TracingMuxerImpl *pTVar1;
  TracingSessionGlobalID TVar2;
  bool bVar3;
  pointer pCVar4;
  function<void_(perfetto::TracingSession::QueryServiceStateCallbackArgs)> local_a8;
  undefined1 local_88 [8];
  type callback_1;
  undefined1 local_48 [8];
  type callback;
  ScopedResource<int,_&perfetto::base::CloseFile,__1,_true,_perfetto::base::internal::DefaultValidityChecker<int,__1>_>
  local_14;
  ConsumerImpl *local_10;
  ConsumerImpl *this_local;
  
  this->connected_ = true;
  local_10 = this;
  pCVar4 = std::
           unique_ptr<perfetto::ConsumerEndpoint,_std::default_delete<perfetto::ConsumerEndpoint>_>
           ::operator->(&this->service_);
  (*pCVar4->_vptr_ConsumerEndpoint[0xc])(pCVar4,3);
  bVar3 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->trace_config_);
  if (bVar3) {
    pTVar1 = this->muxer_;
    TVar2 = this->session_id_;
    perfetto::base::
    ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
    ::ScopedResource(&local_14,-1);
    SetupTracingSession(pTVar1,TVar2,&this->trace_config_,&local_14);
    perfetto::base::
    ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
    ::~ScopedResource(&local_14);
  }
  if ((this->start_pending_ & 1U) != 0) {
    StartTracingSession(this->muxer_,this->session_id_);
  }
  if ((this->get_trace_stats_pending_ & 1U) != 0) {
    std::function<void_(perfetto::TracingSession::GetTraceStatsCallbackArgs)>::function
              ((function<void_(perfetto::TracingSession::GetTraceStatsCallbackArgs)> *)local_48,
               &this->get_trace_stats_callback_);
    std::function<void_(perfetto::TracingSession::GetTraceStatsCallbackArgs)>::operator=
              (&this->get_trace_stats_callback_,(nullptr_t)0x0);
    pTVar1 = this->muxer_;
    TVar2 = this->session_id_;
    std::function<void_(perfetto::TracingSession::GetTraceStatsCallbackArgs)>::function
              ((function<void_(perfetto::TracingSession::GetTraceStatsCallbackArgs)> *)
               &callback_1._M_invoker,
               (function<void_(perfetto::TracingSession::GetTraceStatsCallbackArgs)> *)local_48);
    GetTraceStats(pTVar1,TVar2,(GetTraceStatsCallback *)&callback_1._M_invoker);
    std::function<void_(perfetto::TracingSession::GetTraceStatsCallbackArgs)>::~function
              ((function<void_(perfetto::TracingSession::GetTraceStatsCallbackArgs)> *)
               &callback_1._M_invoker);
    std::function<void_(perfetto::TracingSession::GetTraceStatsCallbackArgs)>::~function
              ((function<void_(perfetto::TracingSession::GetTraceStatsCallbackArgs)> *)local_48);
  }
  bVar3 = ::std::function::operator_cast_to_bool((function *)&this->query_service_state_callback_);
  if (bVar3) {
    std::function<void_(perfetto::TracingSession::QueryServiceStateCallbackArgs)>::function
              ((function<void_(perfetto::TracingSession::QueryServiceStateCallbackArgs)> *)local_88,
               &this->query_service_state_callback_);
    std::function<void_(perfetto::TracingSession::QueryServiceStateCallbackArgs)>::operator=
              (&this->query_service_state_callback_,(nullptr_t)0x0);
    pTVar1 = this->muxer_;
    TVar2 = this->session_id_;
    std::function<void_(perfetto::TracingSession::QueryServiceStateCallbackArgs)>::function
              (&local_a8,
               (function<void_(perfetto::TracingSession::QueryServiceStateCallbackArgs)> *)local_88)
    ;
    QueryServiceState(pTVar1,TVar2,&local_a8);
    std::function<void_(perfetto::TracingSession::QueryServiceStateCallbackArgs)>::~function
              (&local_a8);
    std::function<void_(perfetto::TracingSession::QueryServiceStateCallbackArgs)>::~function
              ((function<void_(perfetto::TracingSession::QueryServiceStateCallbackArgs)> *)local_88)
    ;
  }
  if ((this->stop_pending_ & 1U) != 0) {
    StopTracingSession(this->muxer_,this->session_id_);
  }
  return;
}

Assistant:

void TracingMuxerImpl::ConsumerImpl::OnConnect() {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  PERFETTO_DCHECK(!connected_);
  connected_ = true;

  // Observe data source instance events so we get notified when tracing starts.
  service_->ObserveEvents(ObservableEvents::TYPE_DATA_SOURCES_INSTANCES |
                          ObservableEvents::TYPE_ALL_DATA_SOURCES_STARTED);

  // If the API client configured and started tracing before we connected,
  // tell the backend about it now.
  if (trace_config_)
    muxer_->SetupTracingSession(session_id_, trace_config_);
  if (start_pending_)
    muxer_->StartTracingSession(session_id_);
  if (get_trace_stats_pending_) {
    auto callback = std::move(get_trace_stats_callback_);
    get_trace_stats_callback_ = nullptr;
    muxer_->GetTraceStats(session_id_, std::move(callback));
  }
  if (query_service_state_callback_) {
    auto callback = std::move(query_service_state_callback_);
    query_service_state_callback_ = nullptr;
    muxer_->QueryServiceState(session_id_, std::move(callback));
  }
  if (stop_pending_)
    muxer_->StopTracingSession(session_id_);
}